

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2608::update_prescale(ym2608 *this,uint8_t prescale)

{
  bool bVar1;
  uint8_t prescale_local;
  ym2608 *this_local;
  
  fm_engine_base<ymfm::opn_registers_base<true>_>::set_clock_prescale
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,(uint)prescale);
  ssg_engine::prescale_changed(&this->m_ssg);
  if (this->m_fidelity == OPN_FIDELITY_MIN) {
    if (prescale == '\x02') {
      this->m_fm_samples_per_output = '\x01';
      ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x01','\x06');
    }
    else if (prescale == '\x03') {
      this->m_fm_samples_per_output = '\0';
      ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x01','\x03');
    }
    else {
      this->m_fm_samples_per_output = '\x03';
      ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x02','\x03');
    }
  }
  else if (this->m_fidelity == OPN_FIDELITY_MED) {
    if (prescale == '\x02') {
      this->m_fm_samples_per_output = '\x02';
      ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x01','\x03');
    }
    else if (prescale == '\x03') {
      this->m_fm_samples_per_output = '\x03';
      ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x02','\x03');
    }
    else {
      this->m_fm_samples_per_output = '\x06';
      ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x04','\x03');
    }
  }
  else if (prescale == '\x02') {
    this->m_fm_samples_per_output = '\x06';
    ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x01','\x01');
  }
  else if (prescale == '\x03') {
    this->m_fm_samples_per_output = '\t';
    ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x02','\x01');
  }
  else {
    this->m_fm_samples_per_output = '\x12';
    ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\x04','\x01');
  }
  bVar1 = ssg_engine::overridden(&this->m_ssg);
  if (bVar1) {
    ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::configure(&this->m_ssg_resampler,'\0','\0');
  }
  return;
}

Assistant:

void ym2608::update_prescale(uint8_t prescale)
{
	// tell the FM engine
	m_fm.set_clock_prescale(prescale);
	m_ssg.prescale_changed();

	// Fidelity:   ---- minimum ----    ---- medium -----    ---- maximum-----
	//              rate = clock/48      rate = clock/24      rate = clock/8
	// Prescale    FM rate  SSG rate    FM rate  SSG rate    FM rate  SSG rate
	//     6          3:1     2:3          6:1     4:3         18:1     4:1
	//     3        1.5:1     1:3          3:1     2:3          9:1     2:1
	//     2          1:1     1:6          2:1     1:3          6:1     1:1

	// compute the number of FM samples per output sample, and select the
	// resampler function
	if (m_fidelity == OPN_FIDELITY_MIN)
	{
		switch (prescale)
		{
			default:
			case 6:	m_fm_samples_per_output = 3;	m_ssg_resampler.configure(2, 3);	break;
			case 3: m_fm_samples_per_output = 0;	m_ssg_resampler.configure(1, 3);	break;
			case 2: m_fm_samples_per_output = 1;	m_ssg_resampler.configure(1, 6);	break;
		}
	}
	else if (m_fidelity == OPN_FIDELITY_MED)
	{
		switch (prescale)
		{
			default:
			case 6:	m_fm_samples_per_output = 6;	m_ssg_resampler.configure(4, 3);	break;
			case 3: m_fm_samples_per_output = 3;	m_ssg_resampler.configure(2, 3);	break;
			case 2: m_fm_samples_per_output = 2;	m_ssg_resampler.configure(1, 3);	break;
		}
	}
	else
	{
		switch (prescale)
		{
			default:
			case 6:	m_fm_samples_per_output = 18;	m_ssg_resampler.configure(4, 1);	break;
			case 3: m_fm_samples_per_output = 9;	m_ssg_resampler.configure(2, 1);	break;
			case 2: m_fm_samples_per_output = 6;	m_ssg_resampler.configure(1, 1);	break;
		}
	}

	// if overriding the SSG, override the configuration with the nop
	// resampler to at least keep the sample index moving forward
	if (m_ssg.overridden())
		m_ssg_resampler.configure(0, 0);
}